

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_getcwd(Context *context,IntrinsicResult partialResult)

{
  Value local_438;
  anon_union_8_3_2f476f46_for_data local_428 [2];
  char buf [1024];
  
  getcwd(buf,0x400);
  MiniScript::String::String((String *)local_428,buf);
  local_438.type = String;
  local_438.noInvoke = false;
  local_438.localOnly = Off;
  if (local_428[0].ref == (RefCountedStorage *)0x0) {
    local_428[0] = (anon_union_8_3_2f476f46_for_data)MiniScript::Value::emptyString._8_8_;
  }
  if (local_428[0].ref != (RefCountedStorage *)0x0) {
    (local_428[0].ref)->refCount = (local_428[0].ref)->refCount + 1;
  }
  local_438.data = local_428[0];
  MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_438,true);
  MiniScript::Value::~Value(&local_438);
  MiniScript::String::release((String *)local_428);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_getcwd(Context *context, IntrinsicResult partialResult) {
	char buf[1024];
	getcwd(buf, sizeof(buf));
	return IntrinsicResult(String(buf));
}